

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

void __thiscall SQStringTable::Resize(SQStringTable *this,SQInteger size)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long *in_RDI;
  SQHash h;
  SQString *next;
  SQString *p;
  SQInteger i;
  SQString **oldtable;
  SQInteger oldsize;
  SQStringTable *in_stack_ffffffffffffffc0;
  long local_30;
  long local_28;
  
  lVar1 = in_RDI[1];
  lVar2 = *in_RDI;
  AllocNodes(in_stack_ffffffffffffffc0,(SQInteger)in_RDI);
  for (local_28 = 0; local_28 < lVar1; local_28 = local_28 + 1) {
    local_30 = *(long *)(lVar2 + local_28 * 8);
    while (local_30 != 0) {
      lVar3 = *(long *)(local_30 + 0x20);
      in_stack_ffffffffffffffc0 = (SQStringTable *)(*(ulong *)(local_30 + 0x30) & in_RDI[1] - 1U);
      *(undefined8 *)(local_30 + 0x20) =
           *(undefined8 *)(*in_RDI + (long)in_stack_ffffffffffffffc0 * 8);
      *(long *)(*in_RDI + (long)in_stack_ffffffffffffffc0 * 8) = local_30;
      local_30 = lVar3;
    }
  }
  sq_vm_free(in_stack_ffffffffffffffc0,(SQUnsignedInteger)in_RDI);
  return;
}

Assistant:

void SQStringTable::Resize(SQInteger size)
{
    SQInteger oldsize=_numofslots;
    SQString **oldtable=_strings;
    AllocNodes(size);
    for (SQInteger i=0; i<oldsize; i++){
        SQString *p = oldtable[i];
        while(p){
            SQString *next = p->_next;
            SQHash h = p->_hash&(_numofslots-1);
            p->_next = _strings[h];
            _strings[h] = p;
            p = next;
        }
    }
    SQ_FREE(oldtable,oldsize*sizeof(SQString*));
}